

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
::transfer_n(btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
            *src_node,allocator_type *alloc)

{
  undefined8 uVar1;
  long lVar2;
  
  if ((((ulong)src_node & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar2 = 0;
      do {
        uVar1 = *(undefined8 *)(src_node + lVar2 + src_i * 0x10 + 0x10 + 8);
        *(undefined8 *)(this + lVar2 + dest_i * 0x10 + 0x10) =
             *(undefined8 *)(src_node + lVar2 + src_i * 0x10 + 0x10);
        *(undefined8 *)(this + lVar2 + dest_i * 0x10 + 0x10 + 8) = uVar1;
        lVar2 = lVar2 + 0x10;
      } while (n * 0x10 != lVar2);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, const google::protobuf::OneofDescriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<int, const google::protobuf::OneofDescriptor *, std::less<int>, std::allocator<std::pair<const int, const google::protobuf::OneofDescriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = char]"
               );
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }